

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JFSON.cpp
# Opt level: O2

bool __thiscall JFSON::Json::has_shape(Json *this,shape *types,string *err)

{
  element_type *peVar1;
  bool bVar2;
  int iVar3;
  Type TVar4;
  undefined4 extraout_var;
  string *this_00;
  long lVar5;
  iterator __rhs;
  string local_a0;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  iVar3 = (**((this->m_ptr).super___shared_ptr<JFSON::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
             ->_vptr_JsonValue)();
  if (iVar3 == 5) {
    __rhs = types->_M_array;
    for (lVar5 = types->_M_len * 0x28; lVar5 != 0; lVar5 = lVar5 + -0x28) {
      peVar1 = (this->m_ptr).super___shared_ptr<JFSON::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      iVar3 = (*peVar1->_vptr_JsonValue[0xb])(peVar1,__rhs);
      TVar4 = (**(code **)**(undefined8 **)CONCAT44(extraout_var,iVar3))();
      if (TVar4 != __rhs->second) {
        std::operator+(&local_40,"bad type for ",&__rhs->first);
        std::operator+(&local_a0,&local_40," in ");
        dump_abi_cxx11_(&local_80,this);
        std::operator+(&local_60,&local_a0,&local_80);
        std::__cxx11::string::operator=((string *)err,(string *)&local_60);
        std::__cxx11::string::~string((string *)&local_60);
        std::__cxx11::string::~string((string *)&local_80);
        std::__cxx11::string::~string((string *)&local_a0);
        this_00 = &local_40;
        goto LAB_0010593b;
      }
      __rhs = __rhs + 1;
    }
    bVar2 = true;
  }
  else {
    dump_abi_cxx11_(&local_a0,this);
    std::operator+(&local_60,"expected JSON object, got ",&local_a0);
    std::__cxx11::string::operator=((string *)err,(string *)&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    this_00 = &local_a0;
LAB_0010593b:
    std::__cxx11::string::~string((string *)this_00);
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool Json::has_shape(const shape & types, string & err) const {
    if (!is_object()) {
        err = "expected JSON object, got " + dump();
        return false;
    }

    for (auto & item : types) {
        if ((*this)[item.first].type() != item.second) {
            err = "bad type for " + item.first + " in " + dump();
            return false;
        }
    }

    return true;
}